

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O3

adios2_error adios2_set_parameters(adios2_io *io,char *parameters)

{
  allocator local_59;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"for adios2_io, in call to adios2_set_parameters","");
  adios2::helper::CheckForNullptr<adios2_io>(io,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)local_58,parameters,&local_59);
  adios2::core::IO::SetParameters((string *)io);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  return adios2_error_none;
}

Assistant:

adios2_error adios2_set_parameters(adios2_io *io, const char *parameters)
{
    try
    {
        adios2::helper::CheckForNullptr(io, "for adios2_io, in call to adios2_set_parameters");
        reinterpret_cast<adios2::core::IO *>(io)->SetParameters(parameters);
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_set_parameters"));
    }
}